

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermPartialOrdering.cpp
# Opt level: O2

TermPartialOrdering *
Kernel::TermPartialOrdering::set(TermPartialOrdering *tpo,TermOrderingConstraint con)

{
  bool bVar1;
  int iVar2;
  TermPartialOrdering *this;
  TermPartialOrdering **ptr;
  TermPartialOrdering *local_40;
  tuple<const_Kernel::TermPartialOrdering_*,_Kernel::TermList,_Kernel::TermList,_Kernel::Ordering::Result>
  local_38;
  
  if (set(Kernel::TermPartialOrdering_const*,Kernel::TermOrderingConstraint)::cache == '\0') {
    iVar2 = __cxa_guard_acquire(&set(Kernel::TermPartialOrdering_const*,Kernel::TermOrderingConstraint)
                                 ::cache);
    if (iVar2 != 0) {
      set::cache._timestamp = 1;
      set::cache._size = 0;
      set::cache._deleted = 0;
      set::cache._capacityIndex = 0;
      set::cache._capacity = 0;
      set::cache._20_8_ = 0;
      set::cache._28_8_ = 0;
      set::cache._afterLast._4_4_ = 0;
      __cxa_atexit(Lib::
                   DHMap<std::tuple<const_Kernel::TermPartialOrdering_*,_Kernel::TermList,_Kernel::TermList,_Kernel::Ordering::Result>,_const_Kernel::TermPartialOrdering_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                   ::~DHMap,&set::cache,&__dso_handle);
      __cxa_guard_release(&set(Kernel::TermPartialOrdering_const*,Kernel::TermOrderingConstraint)::
                           cache);
    }
  }
  local_38.
  super__Tuple_impl<0UL,_const_Kernel::TermPartialOrdering_*,_Kernel::TermList,_Kernel::TermList,_Kernel::Ordering::Result>
  .super__Tuple_impl<1UL,_Kernel::TermList,_Kernel::TermList,_Kernel::Ordering::Result>.
  super__Tuple_impl<2UL,_Kernel::TermList,_Kernel::Ordering::Result>.
  super__Tuple_impl<3UL,_Kernel::Ordering::Result>.
  super__Head_base<3UL,_Kernel::Ordering::Result,_false>._M_head_impl =
       (_Head_base<3UL,_Kernel::Ordering::Result,_false>)
       (_Head_base<3UL,_Kernel::Ordering::Result,_false>)con.rel;
  local_38.
  super__Tuple_impl<0UL,_const_Kernel::TermPartialOrdering_*,_Kernel::TermList,_Kernel::TermList,_Kernel::Ordering::Result>
  .super__Tuple_impl<1UL,_Kernel::TermList,_Kernel::TermList,_Kernel::Ordering::Result>.
  super__Head_base<1UL,_Kernel::TermList,_false>._M_head_impl._content._0_4_ = (int)con.lhs._content
  ;
  local_38.
  super__Tuple_impl<0UL,_const_Kernel::TermPartialOrdering_*,_Kernel::TermList,_Kernel::TermList,_Kernel::Ordering::Result>
  .super__Tuple_impl<1UL,_Kernel::TermList,_Kernel::TermList,_Kernel::Ordering::Result>.
  super__Tuple_impl<2UL,_Kernel::TermList,_Kernel::Ordering::Result>.
  super__Head_base<2UL,_Kernel::TermList,_false>._M_head_impl._content = con.rhs._content;
  local_38.
  super__Tuple_impl<0UL,_const_Kernel::TermPartialOrdering_*,_Kernel::TermList,_Kernel::TermList,_Kernel::Ordering::Result>
  .super__Tuple_impl<1UL,_Kernel::TermList,_Kernel::TermList,_Kernel::Ordering::Result>.
  super__Head_base<1UL,_Kernel::TermList,_false>._M_head_impl._content._4_4_ =
       con.lhs._content._4_4_;
  local_40 = (TermPartialOrdering *)0x0;
  local_38.
  super__Tuple_impl<0UL,_const_Kernel::TermPartialOrdering_*,_Kernel::TermList,_Kernel::TermList,_Kernel::Ordering::Result>
  .super__Head_base<0UL,_const_Kernel::TermPartialOrdering_*,_false>._M_head_impl = tpo;
  bVar1 = Lib::
          DHMap<std::tuple<const_Kernel::TermPartialOrdering_*,_Kernel::TermList,_Kernel::TermList,_Kernel::Ordering::Result>,_const_Kernel::TermPartialOrdering_*,_Lib::DefaultHash,_Lib::DefaultHash2>
          ::getValuePtr(&set::cache,&local_38,&ptr,&local_40);
  if (bVar1) {
    this = (TermPartialOrdering *)::operator_new(0x30);
    TermPartialOrdering(this,tpo);
    bVar1 = set(this,con);
    if (bVar1) {
      *ptr = this;
    }
    else {
      Lib::Map<Kernel::TermList,_unsigned_long,_Lib::DefaultHash>::~Map(&this->_nodes);
      ::operator_delete(this,0x30);
      *ptr = (TermPartialOrdering *)0x0;
    }
  }
  return *ptr;
}

Assistant:

const TermPartialOrdering* TermPartialOrdering::set(const TermPartialOrdering* tpo, TermOrderingConstraint con)
{
  static DHMap<std::tuple<const TermPartialOrdering*, TermList, TermList, Result>, const TermPartialOrdering*> cache;
  const TermPartialOrdering** ptr;
  if (cache.getValuePtr(make_tuple(tpo, con.lhs, con.rhs, con.rel), ptr, nullptr)) {
    auto res = new TermPartialOrdering(*tpo);
    if (!res->set(con)) {
      delete res;
      *ptr = nullptr;
    } else {
      *ptr = res;
    }
  }
  return *ptr;
}